

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__1>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_8_1_8991fb9c comp)

{
  unsigned_long uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_01;
  uchar uVar2;
  char cVar3;
  bool bVar4;
  reference piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var6;
  ulong uVar7;
  anon_class_8_1_8991fb9c *paVar8;
  unsigned_long *puVar9;
  int *in_RSI;
  int *in_RDI;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  size_t num;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t right_split;
  size_t left_split;
  size_t num_unknown;
  size_t start_r;
  size_t start_l;
  size_t num_r;
  size_t num_l;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> offsets_r_base;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> offsets_l_base;
  uchar *offsets_r;
  uchar *offsets_l;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  T pivot;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int iVar11;
  undefined4 in_stack_fffffffffffffda4;
  int iVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffda8;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffdb0;
  anon_class_8_1_8991fb9c *paVar13;
  ulong local_248;
  ulong local_240;
  byte local_231;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_220;
  undefined8 in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  uchar *in_stack_fffffffffffffdf8;
  uchar *in_stack_fffffffffffffe00;
  anon_class_8_1_8991fb9c *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  long local_1a8;
  long local_1a0;
  unsigned_long local_198;
  unsigned_long local_190;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_180;
  uchar *local_178;
  uchar *local_170;
  uchar local_168 [128];
  uchar local_e8 [136];
  int *local_60;
  int *local_58;
  undefined1 local_49;
  int *local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  int local_2c;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  local_2c = *piVar5;
  local_38._M_current = local_18[0]._M_current;
  local_40._M_current = local_20;
  do {
    p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_38);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*(p_Var6);
    bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                      (in_stack_fffffffffffffdb0,
                       (HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                       (HighsInt)in_stack_fffffffffffffda8);
  } while (bVar4);
  local_48 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator-(in_stack_fffffffffffffda8,
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  bVar4 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffd98._M_current);
  if (bVar4) {
    do {
      bVar4 = __gnu_cxx::operator<
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffd98._M_current);
      local_231 = 0;
      if (bVar4) {
        p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_40);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (p_Var6);
        bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                          (in_stack_fffffffffffffdb0,
                           (HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                           (HighsInt)in_stack_fffffffffffffda8);
        local_231 = bVar4 ^ 0xff;
      }
    } while ((local_231 & 1) != 0);
  }
  else {
    do {
      p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_40);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var6);
      bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                        (in_stack_fffffffffffffdb0,
                         (HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                         (HighsInt)in_stack_fffffffffffffda8);
    } while (((bVar4 ^ 0xffU) & 1) != 0);
  }
  local_49 = __gnu_cxx::operator>=
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffd98._M_current);
  if (!(bool)local_49) {
    local_58 = local_38._M_current;
    local_60 = local_40._M_current;
    __a._M_current._4_4_ = in_stack_fffffffffffffda4;
    __a._M_current._0_4_ = in_stack_fffffffffffffda0;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (__a,in_stack_fffffffffffffd98);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
    local_170 = align_cacheline<unsigned_char>(local_e8);
    local_178 = align_cacheline<unsigned_char>(local_168);
    local_180._M_current = local_38._M_current;
    local_188._M_current = local_40._M_current;
    local_1a8 = 0;
    local_1a0 = 0;
    local_198 = 0;
    local_190 = 0;
    while (bVar4 = __gnu_cxx::operator<
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffd98._M_current), bVar4) {
      uVar7 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffd98._M_current);
      if (local_190 == 0) {
        local_240 = uVar7;
        if (local_198 == 0) {
          local_240 = uVar7 >> 1;
        }
        local_248 = local_240;
      }
      else {
        local_248 = 0;
      }
      if (local_198 == 0) {
        paVar8 = (anon_class_8_1_8991fb9c *)(uVar7 - local_248);
      }
      else {
        paVar8 = (anon_class_8_1_8991fb9c *)0x0;
      }
      paVar13 = paVar8;
      if (local_248 < 0x40) {
        local_1d0 = 0;
        while (local_1d0 < local_248) {
          local_170[local_190] = (uchar)local_1d0;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_1d0 = local_1d0 + 1;
        }
      }
      else {
        local_1c8 = 0;
        while (local_1c8 < 0x40) {
          uVar2 = (uchar)local_1c8;
          local_170[local_190] = uVar2;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_170[local_190] = uVar2 + '\x01';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_170[local_190] = uVar2 + '\x02';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_170[local_190] = uVar2 + '\x03';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_170[local_190] = uVar2 + '\x04';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_170[local_190] = uVar2 + '\x05';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_170[local_190] = uVar2 + '\x06';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
          local_1c8 = local_1c8 + 8;
          local_170[local_190] = uVar2 + '\a';
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_38);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_190 = ((bVar4 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_38);
        }
      }
      if (paVar8 < (anon_class_8_1_8991fb9c *)0x40) {
        local_1e0 = (anon_class_8_1_8991fb9c *)0x0;
        while (local_1e0 < paVar8) {
          local_1e0 = (anon_class_8_1_8991fb9c *)((long)&local_1e0->this + 1);
          local_178[local_198] = (uchar)local_1e0;
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
        }
      }
      else {
        local_1d8 = 0;
        while (local_1d8 < 0x40) {
          cVar3 = (char)local_1d8;
          local_178[local_198] = cVar3 + '\x01';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_178[local_198] = cVar3 + '\x02';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_178[local_198] = cVar3 + '\x03';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_178[local_198] = cVar3 + '\x04';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_178[local_198] = cVar3 + '\x05';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_178[local_198] = cVar3 + '\x06';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_178[local_198] = cVar3 + '\a';
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
          local_1d8 = local_1d8 + 8;
          local_178[local_198] = (uchar)local_1d8;
          p_Var6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_40);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (p_Var6);
          bVar4 = HighsSymmetryDetection::partitionRefinement::anon_class_8_1_8991fb9c::operator()
                            (paVar13,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffda8);
          local_198 = bVar4 + local_198;
        }
      }
      puVar9 = std::min<unsigned_long>(&local_190,&local_198);
      uVar1 = *puVar9;
      swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_180,local_188,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf0,SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
      local_190 = local_190 - uVar1;
      local_198 = local_198 - uVar1;
      local_1a0 = uVar1 + local_1a0;
      local_1a8 = uVar1 + local_1a8;
      if (local_190 == 0) {
        local_1a0 = 0;
        local_180._M_current = local_38._M_current;
      }
      if (local_198 == 0) {
        local_1a8 = 0;
        local_188._M_current = local_40._M_current;
      }
    }
    if (local_190 != 0) {
      local_170 = local_170 + local_1a0;
      while (local_190 != 0) {
        local_190 = local_190 - 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffda8,
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
                  (&local_40);
        __a_00._M_current._4_4_ = in_stack_fffffffffffffda4;
        __a_00._M_current._0_4_ = in_stack_fffffffffffffda0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_00,in_stack_fffffffffffffd98);
      }
      local_38._M_current = local_40._M_current;
      local_190 = local_190 - 1;
    }
    if (local_198 != 0) {
      local_178 = local_178 + local_1a8;
      while (local_198 != 0) {
        local_198 = local_198 - 1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffda8,
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        __a_01._M_current._4_4_ = in_stack_fffffffffffffda4;
        __a_01._M_current._0_4_ = in_stack_fffffffffffffda0;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_01,in_stack_fffffffffffffd98);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_38);
      }
      local_40._M_current = local_38._M_current;
      local_198 = local_198 - 1;
    }
  }
  local_220 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator-(in_stack_fffffffffffffda8,
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  p_Var6 = &local_220;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var6);
  iVar11 = *piVar5;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  *piVar5 = iVar11;
  iVar12 = local_2c;
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var6);
  *piVar5 = iVar12;
  pVar10 = std::
           make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool&>
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      CONCAT44(iVar12,iVar11),(bool *)in_stack_fffffffffffffd98._M_current);
  return pVar10;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }